

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_switch.cpp
# Opt level: O2

void QtMWidgets::Switch::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QColor *c;
  State *pSVar1;
  code *pcVar2;
  long lVar3;
  undefined8 uVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  bool bVar7;
  State SVar8;
  QColor QVar9;
  QArrayDataPointer<char16_t> local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      SVar8 = *_a[1];
LAB_0016b4f3:
      setState((Switch *)_o,SVar8);
      return;
    }
    if (_id == 1) {
      stateChanged((Switch *)_o,*_a[1]);
      return;
    }
    if (_id == 0) {
      toggled((Switch *)_o,*_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if (4 < (uint)_id) {
      return;
    }
    pSVar1 = (State *)*_a;
    switch(_id) {
    case 0:
      SVar8 = state((Switch *)_o);
      *pSVar1 = SVar8;
      break;
    case 1:
      bVar7 = isChecked((Switch *)_o);
      *(bool *)pSVar1 = bVar7;
      break;
    case 2:
      onText((QString *)&local_28,(Switch *)_o);
      goto LAB_0016b567;
    case 3:
      offText((QString *)&local_28,(Switch *)_o);
LAB_0016b567:
      pDVar5 = *(Data **)pSVar1;
      pcVar6 = *(char16_t **)(pSVar1 + 2);
      *(Data **)pSVar1 = local_28.d;
      *(char16_t **)(pSVar1 + 2) = local_28.ptr;
      uVar4 = *(undefined8 *)(pSVar1 + 4);
      *(qsizetype *)(pSVar1 + 4) = local_28.size;
      local_28.d = pDVar5;
      local_28.ptr = pcVar6;
      local_28.size = uVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
      break;
    case 4:
      QVar9 = onColor((Switch *)_o);
      *(long *)pSVar1 = QVar9._0_8_;
      pSVar1[2] = QVar9.ct._4_4_;
      *(short *)(pSVar1 + 3) = QVar9.ct._8_2_;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      c = (QColor *)*_a;
      switch(_id) {
      case 0:
        SVar8 = c->cspec;
        goto LAB_0016b4f3;
      case 2:
        setOnText((Switch *)_o,(QString *)c);
        return;
      case 3:
        setOffText((Switch *)_o,(QString *)c);
        return;
      case 4:
        setOnColor((Switch *)_o,c);
        return;
      }
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == toggled && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == stateChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
  return;
}

Assistant:

void QtMWidgets::Switch::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Switch *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->toggled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->setState((*reinterpret_cast< std::add_pointer_t<State>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Switch::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Switch::toggled)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Switch::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Switch::stateChanged)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Switch *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< State*>(_v) = _t->state(); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->isChecked(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->onText(); break;
        case 3: *reinterpret_cast< QString*>(_v) = _t->offText(); break;
        case 4: *reinterpret_cast< QColor*>(_v) = _t->onColor(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Switch *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setState(*reinterpret_cast< State*>(_v)); break;
        case 2: _t->setOnText(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setOffText(*reinterpret_cast< QString*>(_v)); break;
        case 4: _t->setOnColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}